

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveIn * __thiscall
chrono::ChArchiveIn::operator>>(ChArchiveIn *this,ChNameValue<chrono::ChVector<double>_*> *bVal)

{
  ChNameValue<chrono::ChVector<double>_*> local_30;
  ChNameValue<chrono::ChVector<double>_*> *local_18;
  ChNameValue<chrono::ChVector<double>_*> *bVal_local;
  ChArchiveIn *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<chrono::ChVector<double>_*> *)this;
  ChNameValue<chrono::ChVector<double>_*>::ChNameValue(&local_30,bVal);
  in<chrono::ChVector<double>>(this,&local_30);
  ChNameValue<chrono::ChVector<double>_*>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveIn& operator>>(ChNameValue<T> bVal) {
          this->in(bVal);
          return (*this);
      }